

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

IStreamingReporterPtr Catch::anon_unknown_1::createReporter(string *reporterName,IConfigPtr *config)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  undefined8 in_RDX;
  undefined8 in_RSI;
  tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_> in_RDI;
  IStreamingReporterPtr *reporter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  ReusableStringStream *in_stack_ffffffffffffff70;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> msg;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  
  msg._M_head_impl =
       (IStreamingReporter *)
       in_RDI.
       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            (msg._M_head_impl,(long *)CONCAT44(extraout_var,iVar2),in_RSI,in_RDX);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                      *)0x143607);
  if (bVar1) {
    return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
            )(__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
              )in_RDI.
               super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
               .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  }
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffa0);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff70,(char (*) [36])in_stack_ffffffffffffff68);
  ReusableStringStream::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff70,(char (*) [2])in_stack_ffffffffffffff68);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff68);
  throw_domain_error((string *)msg._M_head_impl);
}

Assistant:

IStreamingReporterPtr createReporter(std::string const& reporterName, IConfigPtr const& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, config);
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << "'");

            return reporter;
        }